

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddNormal
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pNormalIdx,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pNormals,
          bool pNormalPerVertex)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  size_t sVar7;
  _List_node_base *p_Var8;
  aiVector3D *paVar9;
  _List_node_base *p_Var10;
  float fVar11;
  float fVar12;
  size_t fi;
  aiVector3D *paVar13;
  DeadlyImportError *pDVar14;
  long lVar15;
  _List_node_base *p_Var16;
  size_type __n;
  int *piVar17;
  ulong uVar18;
  ulong uVar19;
  string local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tind;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> norm_arr_copy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  tind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  norm_arr_copy.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  norm_arr_copy.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  norm_arr_copy.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (&norm_arr_copy,
             (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl._M_node._M_size);
  p_Var16 = (_List_node_base *)pNormals;
  while (p_Var16 = (((_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    &p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var16 != (_List_node_base *)pNormals) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&norm_arr_copy,(value_type *)(p_Var16 + 1));
  }
  piVar4 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)piVar5 - (long)piVar4 >> 2;
  if (pNormalPerVertex) {
    if (piVar5 == piVar4) {
      sVar7 = (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl._M_node._M_size;
      uVar2 = pMesh->mNumVertices;
      uVar19 = (ulong)uVar2;
      if (sVar7 != uVar19) {
        pDVar14 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_138,
                   "MeshGeometry_AddNormal. Normals and vertices count must be equal.",
                   (allocator *)&local_d0);
        DeadlyImportError::DeadlyImportError(pDVar14,&local_138);
        __cxa_throw(pDVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar18 = sVar7 * 0xc;
      paVar13 = (aiVector3D *)operator_new__(uVar18);
      if (uVar2 != 0) {
        uVar18 = uVar18 - 0xc;
        memset(paVar13,0,(uVar18 - uVar18 % 0xc) + 0xc);
      }
      pMesh->mNormals = paVar13;
      p_Var16 = (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                ._M_impl._M_node.super__List_node_base._M_next;
      lVar15 = 0;
      for (uVar18 = 0; uVar18 < uVar19; uVar18 = uVar18 + 1) {
        p_Var8 = p_Var16[1]._M_next;
        p_Var10 = p_Var16 + 1;
        p_Var16 = p_Var16->_M_next;
        paVar13 = pMesh->mNormals;
        *(undefined4 *)((long)&paVar13->z + lVar15) = *(undefined4 *)&p_Var10->_M_prev;
        *(_List_node_base **)((long)&paVar13->x + lVar15) = p_Var8;
        uVar19 = (ulong)pMesh->mNumVertices;
        lVar15 = lVar15 + 0xc;
      }
    }
    else {
      if ((long)piVar5 - (long)piVar4 !=
          (long)(pCoordIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pCoordIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start) {
        pDVar14 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_138,"Normals and Coords inidces count must be equal.",
                   (allocator *)&local_d0);
        DeadlyImportError::DeadlyImportError(pDVar14,&local_138);
        __cxa_throw(pDVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&tind,__n);
      for (piVar17 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          piVar17 !=
          (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish; piVar17 = piVar17 + 1) {
        if ((pointer)(long)*piVar17 != (pointer)0xffffffffffffffff) {
          local_138._M_dataplus._M_p = (pointer)(long)*piVar17;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    (&tind,(unsigned_long *)&local_138);
        }
      }
      uVar2 = pMesh->mNumVertices;
      uVar19 = (ulong)uVar2;
      paVar13 = (aiVector3D *)operator_new__(uVar19 * 0xc);
      if (uVar2 != 0) {
        uVar18 = uVar19 * 0xc - 0xc;
        memset(paVar13,0,(uVar18 - uVar18 % 0xc) + 0xc);
      }
      pMesh->mNormals = paVar13;
      lVar15 = 0;
      for (uVar18 = 0;
          (uVar18 < uVar19 &&
          (uVar18 < (ulong)((long)tind.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)tind.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3)));
          uVar18 = uVar18 + 1) {
        uVar19 = tind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar18];
        if ((ulong)(((long)norm_arr_copy.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)norm_arr_copy.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar19) {
          pDVar14 = (DeadlyImportError *)
                    __cxa_allocate_exception
                              (0x10,norm_arr_copy.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                               ((long)norm_arr_copy.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)norm_arr_copy.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) % 0xc);
          to_string<unsigned_long>
                    (&local_90,
                     tind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar18]);
          std::operator+(&local_70,"MeshGeometry_AddNormal. Normal index(",&local_90);
          std::operator+(&local_50,&local_70,") is out of range. Normals count: ");
          to_string<unsigned_long>
                    (&local_b0,
                     ((long)norm_arr_copy.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)norm_arr_copy.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc);
          std::operator+(&local_d0,&local_50,&local_b0);
          std::operator+(&local_138,&local_d0,".");
          DeadlyImportError::DeadlyImportError(pDVar14,&local_138);
          __cxa_throw(pDVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        paVar13 = pMesh->mNormals;
        *(float *)((long)&paVar13->z + lVar15) =
             norm_arr_copy.
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start[uVar19].z;
        *(undefined8 *)((long)&paVar13->x + lVar15) =
             *(undefined8 *)
              (norm_arr_copy.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start + uVar19);
        uVar19 = (ulong)pMesh->mNumVertices;
        lVar15 = lVar15 + 0xc;
      }
    }
  }
  else {
    if (piVar5 == piVar4) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&tind,(ulong)pMesh->mNumFaces);
      for (local_138._M_dataplus._M_p = (pointer)0x0;
          local_138._M_dataplus._M_p < (pointer)(ulong)pMesh->mNumFaces;
          local_138._M_dataplus._M_p = local_138._M_dataplus._M_p + 1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&tind,(value_type_conflict1 *)&local_138);
      }
    }
    else {
      if (__n != pMesh->mNumFaces) {
        pDVar14 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_138,"Normals faces count must be equal to mesh faces count.",
                   (allocator *)&local_d0);
        DeadlyImportError::DeadlyImportError(pDVar14,&local_138);
        __cxa_throw(pDVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&tind,__n);
      piVar5 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      piVar6 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar15 = 0; (long)piVar5 - (long)piVar6 >> 2 != lVar15; lVar15 = lVar15 + 1) {
        local_138._M_dataplus._M_p = (pointer)(long)piVar4[lVar15];
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&tind,(unsigned_long *)&local_138);
      }
    }
    uVar2 = pMesh->mNumVertices;
    uVar19 = (ulong)uVar2 * 0xc;
    paVar13 = (aiVector3D *)operator_new__(uVar19);
    if (uVar2 != 0) {
      uVar19 = uVar19 - 0xc;
      memset(paVar13,0,(uVar19 - uVar19 % 0xc) + 0xc);
    }
    pMesh->mNormals = paVar13;
    for (uVar19 = 0; uVar19 < pMesh->mNumFaces; uVar19 = uVar19 + 1) {
      fVar11 = norm_arr_copy.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start
               [tind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19]].x;
      fVar12 = norm_arr_copy.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start
               [tind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19]].y;
      fVar1 = norm_arr_copy.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start
              [tind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar19]].z;
      uVar2 = pMesh->mFaces[uVar19].mNumIndices;
      for (uVar18 = 0; uVar2 != uVar18; uVar18 = uVar18 + 1) {
        paVar9 = pMesh->mNormals;
        uVar3 = pMesh->mFaces[uVar19].mIndices[uVar18];
        paVar13 = paVar9 + uVar3;
        paVar13->x = fVar11;
        paVar13->y = fVar12;
        paVar9[uVar3].z = fVar1;
      }
    }
  }
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&norm_arr_copy.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&tind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddNormal(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pNormalIdx,
								const std::list<aiVector3D>& pNormals, const bool pNormalPerVertex) const
{
    std::vector<size_t> tind;
    std::vector<aiVector3D> norm_arr_copy;

	// copy list to array because we are need indexed access to normals.
	norm_arr_copy.reserve(pNormals.size());
    for ( std::list<aiVector3D>::const_iterator it = pNormals.begin(); it != pNormals.end(); ++it )
    {
        norm_arr_copy.push_back( *it );
    }

	if(pNormalPerVertex)
	{
		if(pNormalIdx.size() > 0)
		{
			// check indices array count.
			if(pNormalIdx.size() != pCoordIdx.size()) throw DeadlyImportError("Normals and Coords inidces count must be equal.");

			tind.reserve(pNormalIdx.size());
			for(std::vector<int32_t>::const_iterator it = pNormalIdx.begin(); it != pNormalIdx.end(); ++it)
			{
				if(*it != (-1)) tind.push_back(*it);
			}

			// copy normals to mesh
			pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
			for(size_t i = 0; (i < pMesh.mNumVertices) && (i < tind.size()); i++)
			{
				if(tind[i] >= norm_arr_copy.size())
					throw DeadlyImportError("MeshGeometry_AddNormal. Normal index(" + to_string(tind[i]) +
											") is out of range. Normals count: " + to_string(norm_arr_copy.size()) + ".");

				pMesh.mNormals[i] = norm_arr_copy[tind[i]];
			}
		}
		else
		{
			if(pNormals.size() != pMesh.mNumVertices) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and vertices count must be equal.");

			// copy normals to mesh
			pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
			std::list<aiVector3D>::const_iterator norm_it = pNormals.begin();
			for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mNormals[i] = *norm_it++;
		}
	}// if(pNormalPerVertex)
	else
	{
		if(pNormalIdx.size() > 0)
		{
			if(pMesh.mNumFaces != pNormalIdx.size()) throw DeadlyImportError("Normals faces count must be equal to mesh faces count.");

			std::vector<int32_t>::const_iterator normidx_it = pNormalIdx.begin();

			tind.reserve(pNormalIdx.size());
			for(size_t i = 0, i_e = pNormalIdx.size(); i < i_e; i++) tind.push_back(*normidx_it++);

		}
		else
		{
			tind.reserve(pMesh.mNumFaces);
			for(size_t i = 0; i < pMesh.mNumFaces; i++) tind.push_back(i);

		}

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			aiVector3D tnorm;

			tnorm = norm_arr_copy[tind[fi]];
			for(size_t vi = 0, vi_e = pMesh.mFaces[fi].mNumIndices; vi < vi_e; vi++) pMesh.mNormals[pMesh.mFaces[fi].mIndices[vi]] = tnorm;
		}
	}// if(pNormalPerVertex) else
}